

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-multicast-interface6.c
# Opt level: O3

int run_test_udp_multicast_interface6(void)

{
  sa_family_t sVar1;
  int iVar2;
  int extraout_EAX;
  int extraout_EAX_00;
  anon_union_28_2_e90107a3_for_address *paVar3;
  uv_loop_t *loop;
  ulong uVar4;
  int iVar5;
  sockaddr_in6 *addr_00;
  uv_udp_t *loop_00;
  bool bVar6;
  sockaddr_in6 addr;
  sockaddr_in6 baddr;
  uv_udp_send_t req;
  sockaddr_in6 local_198;
  sockaddr_in6 local_17c;
  uv_buf_t local_160;
  uv_interface_address_t *local_150;
  
  iVar2 = uv_interface_addresses(&stack0xfffffffffffffeb0,(int *)&local_198);
  if (iVar2 != 0) {
LAB_0018628a:
    run_test_udp_multicast_interface6_cold_1();
    return 1;
  }
  if ((long)(int)local_198._0_4_ < 1) {
    uv_free_interface_addresses(local_150,local_198._0_4_);
    goto LAB_0018628a;
  }
  paVar3 = &local_150->address;
  uVar4 = 1;
  do {
    sVar1 = (paVar3->address4).sin_family;
    if (sVar1 == 10) break;
    paVar3 = (anon_union_28_2_e90107a3_for_address *)((long)paVar3 + 0x50);
    bVar6 = uVar4 < (ulong)(long)(int)local_198._0_4_;
    uVar4 = uVar4 + 1;
  } while (bVar6);
  uv_free_interface_addresses(local_150,local_198._0_4_);
  if (sVar1 != 10) goto LAB_0018628a;
  loop_00 = (uv_udp_t *)0x1a8f2b;
  iVar5 = 0x23a3;
  iVar2 = uv_ip6_addr("::1",0x23a3,&local_198);
  if (iVar2 == 0) {
    loop_00 = (uv_udp_t *)uv_default_loop();
    iVar5 = 0x578bb0;
    iVar2 = uv_udp_init((uv_loop_t *)loop_00,&server);
    if (iVar2 != 0) goto LAB_0018629b;
    loop_00 = (uv_udp_t *)0x1a8c0b;
    iVar5 = 0;
    iVar2 = uv_ip6_addr("::",0,&local_17c);
    if (iVar2 != 0) goto LAB_001862a0;
    loop_00 = &server;
    addr_00 = &local_17c;
    iVar2 = uv_udp_bind(&server,(sockaddr *)addr_00,0);
    iVar5 = (int)addr_00;
    if (iVar2 != 0) goto LAB_001862a5;
    loop_00 = &server;
    iVar5 = 0;
    iVar2 = uv_udp_set_multicast_interface(&server,(char *)0x0);
    if (iVar2 != 0) goto LAB_001862aa;
    local_160 = uv_buf_init("PING",4);
    iVar5 = 0x578bb0;
    loop_00 = (uv_udp_t *)&stack0xfffffffffffffeb0;
    iVar2 = uv_udp_send((uv_udp_send_t *)loop_00,&server,&local_160,1,(sockaddr *)&local_198,
                        sv_send_cb);
    if (iVar2 != 0) goto LAB_001862af;
    if (close_cb_called != 0) goto LAB_001862b4;
    if (sv_send_cb_called != 0) goto LAB_001862b9;
    loop_00 = (uv_udp_t *)uv_default_loop();
    iVar5 = 0;
    uv_run((uv_loop_t *)loop_00,UV_RUN_DEFAULT);
    if (sv_send_cb_called != 1) goto LAB_001862be;
    if (close_cb_called != 1) goto LAB_001862c3;
    loop = uv_default_loop();
    uv_walk(loop,close_walk_cb,(void *)0x0);
    iVar5 = 0;
    uv_run(loop,UV_RUN_DEFAULT);
    loop_00 = (uv_udp_t *)uv_default_loop();
    iVar2 = uv_loop_close((uv_loop_t *)loop_00);
    if (iVar2 == 0) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_udp_multicast_interface6_cold_2();
LAB_0018629b:
    run_test_udp_multicast_interface6_cold_3();
LAB_001862a0:
    run_test_udp_multicast_interface6_cold_4();
LAB_001862a5:
    run_test_udp_multicast_interface6_cold_5();
LAB_001862aa:
    run_test_udp_multicast_interface6_cold_6();
LAB_001862af:
    run_test_udp_multicast_interface6_cold_7();
LAB_001862b4:
    run_test_udp_multicast_interface6_cold_8();
LAB_001862b9:
    run_test_udp_multicast_interface6_cold_9();
LAB_001862be:
    run_test_udp_multicast_interface6_cold_10();
LAB_001862c3:
    run_test_udp_multicast_interface6_cold_11();
  }
  run_test_udp_multicast_interface6_cold_12();
  if ((uv_loop_t *)loop_00 == (uv_loop_t *)0x0) {
    sv_send_cb_cold_3();
  }
  else if (iVar5 == 0) {
    loop_00 = *(uv_udp_t **)&((uv_loop_t *)loop_00)->backend_fd;
    if (loop_00 == &client || loop_00 == &server) {
      sv_send_cb_called = sv_send_cb_called + 1;
      uv_close((uv_handle_t *)loop_00,close_cb);
      return extraout_EAX;
    }
    goto LAB_00186316;
  }
  sv_send_cb_cold_1();
LAB_00186316:
  sv_send_cb_cold_2();
  if (loop_00 == &client || loop_00 == &server) {
    close_cb_called = close_cb_called + 1;
    return (int)CONCAT71(0x578b,loop_00 == &server);
  }
  close_cb_cold_1();
  iVar2 = uv_is_closing((uv_handle_t *)loop_00);
  if (iVar2 == 0) {
    uv_close((uv_handle_t *)loop_00,(uv_close_cb)0x0);
    return extraout_EAX_00;
  }
  return iVar2;
}

Assistant:

TEST_IMPL(udp_multicast_interface6) {
/* TODO(gengjiawen): Fix test on QEMU. */
#if defined(__QEMU__)
  RETURN_SKIP("Test does not currently work in QEMU");
#endif

  int r;
  uv_udp_send_t req;
  uv_buf_t buf;
  struct sockaddr_in6 addr;
  struct sockaddr_in6 baddr;

  if (!can_ipv6())
    RETURN_SKIP("IPv6 not supported");

  ASSERT(0 == uv_ip6_addr("::1", TEST_PORT, &addr));

  r = uv_udp_init(uv_default_loop(), &server);
  ASSERT(r == 0);

  ASSERT(0 == uv_ip6_addr("::", 0, &baddr));
  r = uv_udp_bind(&server, (const struct sockaddr*)&baddr, 0);
  ASSERT(r == 0);

#if defined(__APPLE__) || defined(__FreeBSD__) || defined(__FreeBSD_kernel__)
  r = uv_udp_set_multicast_interface(&server, "::1%lo0");
#else
  r = uv_udp_set_multicast_interface(&server, NULL);
#endif
  ASSERT(r == 0);

  /* server sends "PING" */
  buf = uv_buf_init("PING", 4);
  r = uv_udp_send(&req,
                  &server,
                  &buf,
                  1,
                  (const struct sockaddr*)&addr,
                  sv_send_cb);
  ASSERT(r == 0);

  ASSERT(close_cb_called == 0);
  ASSERT(sv_send_cb_called == 0);

  /* run the loop till all events are processed */
  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT(sv_send_cb_called == 1);
  ASSERT(close_cb_called == 1);

  MAKE_VALGRIND_HAPPY();
  return 0;
}